

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<TPZTensor<TFad<6,_double>_>,_3> * __thiscall
TPZManVector<TPZTensor<TFad<6,_double>_>,_3>::operator=
          (TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *this,
          TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *copy)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *puVar4;
  long lVar5;
  TPZTensor<TFad<6,_double>_> *pTVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (this != copy) {
    uVar8 = (copy->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements;
    if (((this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc < (long)uVar8) &&
       (pTVar6 = (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore,
       pTVar6 != this->fExtAlloc && pTVar6 != (TPZTensor<TFad<6,_double>_> *)0x0)) {
      dVar1 = pTVar6[-1].fData.fExtAlloc[5].dx_[5];
      if (dVar1 != 0.0) {
        lVar5 = (long)dVar1 * 0x1a8;
        do {
          *(undefined ***)((long)pTVar6[-1].fData.fExtAlloc[0].dx_ + lVar5 + -0x38) =
               &PTR__TPZTensor_0189f120;
          TPZManVector<TFad<6,_double>,_6>::~TPZManVector
                    ((TPZManVector<TFad<6,_double>,_6> *)((long)pTVar6 + lVar5 + -0x1a0));
          lVar5 = lVar5 + -0x1a8;
        } while (lVar5 != 0);
      }
      operator_delete__(pTVar6[-1].fData.fExtAlloc[5].dx_ + 5,(long)dVar1 * 0x1a8 + 8);
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = (TPZTensor<TFad<6,_double>_> *)0x0
      ;
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
    }
    if ((long)uVar8 < 4) {
      pTVar6 = (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore;
      if (pTVar6 != (TPZTensor<TFad<6,_double>_> *)0x0 && pTVar6 != this->fExtAlloc) {
        dVar1 = pTVar6[-1].fData.fExtAlloc[5].dx_[5];
        if (dVar1 != 0.0) {
          lVar5 = (long)dVar1 * 0x1a8;
          do {
            *(undefined ***)((long)pTVar6[-1].fData.fExtAlloc[0].dx_ + lVar5 + -0x38) =
                 &PTR__TPZTensor_0189f120;
            TPZManVector<TFad<6,_double>,_6>::~TPZManVector
                      ((TPZManVector<TFad<6,_double>,_6> *)((long)pTVar6 + lVar5 + -0x1a0));
            lVar5 = lVar5 + -0x1a8;
          } while (lVar5 != 0);
        }
        operator_delete__(pTVar6[-1].fData.fExtAlloc[5].dx_ + 5,(long)dVar1 * 0x1a8 + 8);
      }
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = 0;
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = this->fExtAlloc;
    }
    else if ((this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc < (long)uVar8) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar8;
      uVar3 = SUB168(auVar2 * ZEXT816(0x1a8),0);
      uVar7 = uVar3 + 8;
      if (0xfffffffffffffff7 < uVar3) {
        uVar7 = 0xffffffffffffffff;
      }
      if (SUB168(auVar2 * ZEXT816(0x1a8),8) != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      puVar4 = (ulong *)operator_new__(uVar7);
      *puVar4 = uVar8;
      lVar5 = 0;
      pTVar6 = (TPZTensor<TFad<6,_double>_> *)(puVar4 + 1);
      do {
        TPZTensor<TFad<6,_double>_>::TPZTensor(pTVar6);
        lVar5 = lVar5 + -0x1a8;
        pTVar6 = pTVar6 + 1;
      } while (uVar8 * -0x1a8 - lVar5 != 0);
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore =
           (TPZTensor<TFad<6,_double>_> *)(puVar4 + 1);
      (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = uVar8;
    }
    (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = uVar8;
    if (0 < (long)uVar8) {
      lVar5 = 8;
      do {
        TPZManVector<TFad<6,_double>,_6>::operator=
                  ((TPZManVector<TFad<6,_double>,_6> *)
                   ((long)(((this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore)->fData).
                          fExtAlloc[0].dx_ + lVar5 + -0x38),
                   (TPZManVector<TFad<6,_double>,_6> *)
                   ((long)(((copy->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore)->fData).
                          fExtAlloc[0].dx_ + lVar5 + -0x38));
        lVar5 = lVar5 + 0x1a8;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}